

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void set_ips(ns_connection *nc,int is_rem)

{
  void *pvVar1;
  long lVar2;
  int flags;
  long local_b8;
  char local_98 [8];
  char buf [100];
  mg_connection *c;
  connection *conn;
  int is_rem_local;
  ns_connection *nc_local;
  
  pvVar1 = nc->user_data;
  flags = 3;
  if (is_rem != 0) {
    flags = 7;
  }
  ns_sock_to_str(nc->sock,local_98,100,flags);
  if (is_rem == 0) {
    lVar2 = (long)pvVar1 + 0x58;
    local_b8 = (long)pvVar1 + 0x8a;
  }
  else {
    lVar2 = (long)pvVar1 + 0x28;
    local_b8 = (long)pvVar1 + 0x88;
  }
  __isoc99_sscanf(local_98,"%47[^:]:%hu",lVar2,local_b8);
  return;
}

Assistant:

static void set_ips(struct ns_connection *nc, int is_rem) {
  struct connection *conn = (struct connection *) nc->user_data;
  struct mg_connection *c = &conn->mg_conn;
  char buf[100];

  ns_sock_to_str(nc->sock, buf, sizeof(buf), is_rem ? 7 : 3);
  sscanf(buf, "%47[^:]:%hu",
         is_rem ? c->remote_ip : c->local_ip,
         is_rem ? &c->remote_port : &c->local_port);
  //DBG(("%p %s %s", conn, is_rem ? "rem" : "loc", buf));
}